

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmCore.c
# Opt level: O3

int Sfm_NodeResub(Sfm_Ntk_t *p,int iNode)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  long lVar4;
  
  p->nNodesTried = p->nNodesTried + 1;
  iVar3 = Sfm_NtkCreateWindow(p,iNode,p->pPars->fVeryVerbose);
  if ((iVar3 == 0) || (iVar3 = Sfm_NtkWindowToSolver(p), iVar3 == 0)) {
    return 0;
  }
  if ((-1 < iNode) && (iVar3 = (p->vFanins).nSize, iNode < iVar3)) {
    lVar4 = 0;
    do {
      pVVar2 = (p->vFanins).pArray;
      if (pVVar2[(uint)iNode].nSize <= lVar4) {
        if (p->pPars->fArea != 0) {
          return 0;
        }
        lVar4 = 0;
        goto LAB_005247cb;
      }
      uVar1 = pVVar2[(uint)iNode].pArray[lVar4];
      if ((p->nPis <= (int)uVar1) && ((int)(p->nPos + uVar1) < p->nObjs)) {
        if (((int)uVar1 < 0) || ((p->vFanouts).nSize <= (int)uVar1)) break;
        if (((p->vFanouts).pArray[uVar1].nSize == 1) &&
           (iVar3 = Sfm_NodeResubSolve(p,iNode,(int)lVar4,0), iVar3 != 0)) {
          return 1;
        }
      }
      lVar4 = lVar4 + 1;
      iVar3 = (p->vFanins).nSize;
    } while (iNode < iVar3);
  }
  goto LAB_00524797;
LAB_005247cb:
  do {
    pVVar2 = (p->vFanins).pArray;
    if (pVVar2[(uint)iNode].nSize <= lVar4) {
      return 0;
    }
    uVar1 = pVVar2[(uint)iNode].pArray[lVar4];
    if (((int)uVar1 < p->nPis) || (p->nObjs <= (int)(p->nPos + uVar1))) {
LAB_00524809:
      iVar3 = Sfm_NodeResubSolve(p,iNode,(int)lVar4,1);
      if (iVar3 != 0) {
        return 1;
      }
      iVar3 = (p->vFanins).nSize;
    }
    else {
      if (((int)uVar1 < 0) || ((p->vFanouts).nSize <= (int)uVar1)) break;
      if ((p->vFanouts).pArray[uVar1].nSize != 1) goto LAB_00524809;
    }
    lVar4 = lVar4 + 1;
  } while (iNode < iVar3);
LAB_00524797:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Sfm_NodeResub( Sfm_Ntk_t * p, int iNode )
{
    int i, iFanin;
    p->nNodesTried++;
    // prepare SAT solver
    if ( !Sfm_NtkCreateWindow( p, iNode, p->pPars->fVeryVerbose ) )
        return 0;
    if ( !Sfm_NtkWindowToSolver( p ) )
        return 0;
    // try replacing area critical fanins
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
        if ( Sfm_ObjIsNode(p, iFanin) && Sfm_ObjFanoutNum(p, iFanin) == 1 )
        {
            if ( Sfm_NodeResubSolve( p, iNode, i, 0 ) )
                return 1;
        }
    if ( p->pPars->fArea )
        return 0;
    // try removing redundant edges
    Sfm_ObjForEachFanin( p, iNode, iFanin, i )
        if ( !(Sfm_ObjIsNode(p, iFanin) && Sfm_ObjFanoutNum(p, iFanin) == 1) )
        {
            if ( Sfm_NodeResubSolve( p, iNode, i, 1 ) )
                return 1;
        }
/*
    // try replacing area critical fanins while adding two new fanins
    if ( Sfm_ObjFaninNum(p, iNode) < p->nFaninMax )
        Abc_ObjForEachFanin( pNode, pFanin, i )
            if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
            {
                if ( Abc_NtkMfsSolveSatResub2( p, pNode, i, -1 ) )
                    return 1;
            }
*/
    return 0;
}